

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O0

bool __thiscall QSharedMemoryPosix::detach(QSharedMemoryPosix *this,QSharedMemoryPrivate *self)

{
  int iVar1;
  long in_RSI;
  QSharedMemoryPosix *in_RDI;
  QSharedMemoryPrivate *in_stack_00000030;
  undefined1 in_stack_00000160 [16];
  QSharedMemoryPrivate *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  
  iVar1 = munmap(*(void **)(in_RSI + 0x78),*(size_t *)(in_RSI + 0x80));
  if (iVar1 != -1) {
    *(undefined8 *)(in_RSI + 0x78) = 0;
    *(undefined8 *)(in_RSI + 0x80) = 0;
    cleanHandle(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffd8,(size_t)in_RDI);
    QSharedMemoryPrivate::setUnixErrorString(in_stack_00000030,(QLatin1StringView)in_stack_00000160)
    ;
  }
  return iVar1 != -1;
}

Assistant:

bool QSharedMemoryPosix::detach(QSharedMemoryPrivate *self)
{
    // detach from the memory segment
    if (::munmap(self->memory, size_t(self->size)) == -1) {
        self->setUnixErrorString("QSharedMemory::detach (munmap)"_L1);
        return false;
    }
    self->memory = 0;
    self->size = 0;

#ifdef Q_OS_QNX
    // On QNX the st_nlink field of struct stat contains the number of
    // active shm_open() connections to the shared memory file, so we
    // can use it to automatically clean up the file once the last
    // user has detached from it.

    // get the number of current attachments
    int shm_nattch = 0;
    QT_STATBUF st;
    if (QT_FSTAT(hand, &st) == 0) {
        // subtract 2 from linkcount: one for our own open and one for the dir entry
        shm_nattch = st.st_nlink - 2;
    }

    cleanHandle(self);

    // if there are no attachments then unlink the shared memory
    if (shm_nattch == 0) {
        const QByteArray shmName = QFile::encodeName(self->nativeKey.nativeKey());
        if (::shm_unlink(shmName.constData()) == -1 && errno != ENOENT)
            self->setUnixErrorString("QSharedMemory::detach (shm_unlink)"_L1);
    }
#else
    // On non-QNX systems (tested Linux and Haiku), the st_nlink field is always 1,
    // so we'll simply leak the shared memory files.
    cleanHandle(self);
#endif

    return true;
}